

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O3

UBool __thiscall icu_63::RuleBasedBreakIterator::BreakCache::populateFollowing(BreakCache *this)

{
  ushort uVar1;
  int32_t iVar2;
  UBool UVar3;
  int32_t iVar4;
  uint uVar5;
  int iVar6;
  RuleBasedBreakIterator *pRVar7;
  uint16_t uVar8;
  int32_t ruleStatusIdx;
  int32_t local_28 [2];
  
  iVar4 = this->fBoundaries[this->fEndBufIdx];
  uVar1 = this->fStatuses[this->fEndBufIdx];
  local_28[0] = 0;
  local_28[1] = 0;
  UVar3 = DictionaryCache::following(this->fBI->fDictionaryCache,iVar4,local_28 + 1,local_28);
  if (UVar3 == '\0') {
    pRVar7 = this->fBI;
    pRVar7->fPosition = iVar4;
    local_28[1] = handleNext(pRVar7);
    if (local_28[1] == -1) {
      return '\0';
    }
    pRVar7 = this->fBI;
    local_28[0] = pRVar7->fRuleStatusIndex;
    if (pRVar7->fDictionaryCharCount != 0) {
      DictionaryCache::populateDictionary
                (pRVar7->fDictionaryCache,iVar4,local_28[1],(uint)uVar1,local_28[0]);
      UVar3 = DictionaryCache::following(this->fBI->fDictionaryCache,iVar4,local_28 + 1,local_28);
      uVar8 = (uint16_t)local_28[0];
      if (UVar3 != '\0') goto LAB_0029e279;
    }
    uVar5 = this->fEndBufIdx + 1U & 0x7f;
    if (uVar5 == this->fStartBufIdx) {
      this->fStartBufIdx = this->fEndBufIdx + 7U & 0x7f;
    }
    this->fBoundaries[uVar5] = local_28[1];
    this->fStatuses[uVar5] = (uint16_t)local_28[0];
    this->fEndBufIdx = uVar5;
    this->fBufIdx = uVar5;
    this->fTextIdx = local_28[1];
    pRVar7 = this->fBI;
    iVar6 = 6;
    do {
      iVar4 = handleNext(pRVar7);
      if (iVar4 == -1) {
        return '\x01';
      }
      pRVar7 = this->fBI;
      if (pRVar7->fDictionaryCharCount != 0) {
        return '\x01';
      }
      iVar2 = pRVar7->fRuleStatusIndex;
      uVar5 = this->fEndBufIdx + 1U & 0x7f;
      if (uVar5 == this->fStartBufIdx) {
        this->fStartBufIdx = this->fEndBufIdx + 7U & 0x7f;
      }
      this->fBoundaries[uVar5] = iVar4;
      this->fStatuses[uVar5] = (uint16_t)iVar2;
      this->fEndBufIdx = uVar5;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  else {
    uVar8 = (uint16_t)local_28[0];
LAB_0029e279:
    uVar5 = this->fEndBufIdx + 1U & 0x7f;
    if (uVar5 == this->fStartBufIdx) {
      this->fStartBufIdx = this->fEndBufIdx + 7U & 0x7f;
    }
    this->fBoundaries[uVar5] = local_28[1];
    this->fStatuses[uVar5] = uVar8;
    this->fEndBufIdx = uVar5;
    this->fBufIdx = uVar5;
    this->fTextIdx = local_28[1];
  }
  return '\x01';
}

Assistant:

UBool RuleBasedBreakIterator::BreakCache::populateFollowing() {
    int32_t fromPosition = fBoundaries[fEndBufIdx];
    int32_t fromRuleStatusIdx = fStatuses[fEndBufIdx];
    int32_t pos = 0;
    int32_t ruleStatusIdx = 0;

    if (fBI->fDictionaryCache->following(fromPosition, &pos, &ruleStatusIdx)) {
        addFollowing(pos, ruleStatusIdx, UpdateCachePosition);
        return TRUE;
    }

    fBI->fPosition = fromPosition;
    pos = fBI->handleNext();
    if (pos == UBRK_DONE) {
        return FALSE;
    }

    ruleStatusIdx = fBI->fRuleStatusIndex;
    if (fBI->fDictionaryCharCount > 0) {
        // The text segment obtained from the rules includes dictionary characters.
        // Subdivide it, with subdivided results going into the dictionary cache.
        fBI->fDictionaryCache->populateDictionary(fromPosition, pos, fromRuleStatusIdx, ruleStatusIdx);
        if (fBI->fDictionaryCache->following(fromPosition, &pos, &ruleStatusIdx)) {
            addFollowing(pos, ruleStatusIdx, UpdateCachePosition);
            return TRUE;
            // TODO: may want to move a sizable chunk of dictionary cache to break cache at this point.
            //       But be careful with interactions with populateNear().
        }
    }

    // Rule based segment did not include dictionary characters.
    // Or, it did contain dictionary chars, but the dictionary segmenter didn't handle them,
    //    meaning that we didn't take the return, above.
    // Add its end point to the cache.
    addFollowing(pos, ruleStatusIdx, UpdateCachePosition);

    // Add several non-dictionary boundaries at this point, to optimize straight forward iteration.
    //    (subsequent calls to BreakIterator::next() will take the fast path, getting cached results.
    //
    for (int count=0; count<6; ++count) {
        pos = fBI->handleNext();
        if (pos == UBRK_DONE || fBI->fDictionaryCharCount > 0) {
            break;
        }
        addFollowing(pos, fBI->fRuleStatusIndex, RetainCachePosition);
    }

    return TRUE;
}